

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * __thiscall pugi::xml_node::child_value(xml_node *this,char_t *name_)

{
  xml_node xVar1;
  xml_node_struct *pxVar2;
  
  xVar1 = child(this,name_);
  if (xVar1._root != (xml_node_struct *)0x0) {
    for (pxVar2 = (xVar1._root)->first_child; pxVar2 != (xml_node_struct *)0x0;
        pxVar2 = pxVar2->next_sibling) {
      if ((pxVar2->value != (char_t *)0x0) && ((pxVar2->header & 6) == 2)) {
        return pxVar2->value;
      }
    }
  }
  return "";
}

Assistant:

PUGI__FN const char_t* xml_node::child_value(const char_t* name_) const
	{
		return child(name_).child_value();
	}